

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

UBool __thiscall
icu_63::CollationIterator::CEBuffer::ensureAppendCapacity
          (CEBuffer *this,int32_t appCap,UErrorCode *errorCode)

{
  int iVar1;
  long *plVar2;
  UBool UVar3;
  int newCapacity;
  
  newCapacity = (this->buffer).capacity;
  iVar1 = appCap + this->length;
  UVar3 = '\x01';
  if (newCapacity < iVar1) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      do {
        newCapacity = newCapacity << (newCapacity < 1000) + 1;
      } while (newCapacity < iVar1);
      plVar2 = MaybeStackArray<long,_40>::resize(&this->buffer,newCapacity,this->length);
      if (plVar2 != (long *)0x0) {
        return '\x01';
      }
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UBool
CollationIterator::CEBuffer::ensureAppendCapacity(int32_t appCap, UErrorCode &errorCode) {
    int32_t capacity = buffer.getCapacity();
    if((length + appCap) <= capacity) { return TRUE; }
    if(U_FAILURE(errorCode)) { return FALSE; }
    do {
        if(capacity < 1000) {
            capacity *= 4;
        } else {
            capacity *= 2;
        }
    } while(capacity < (length + appCap));
    int64_t *p = buffer.resize(capacity, length);
    if(p == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    return TRUE;
}